

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall
goodform::array_validator::for_each
          (array_validator *this,function<void_(goodform::sub_form_&,_unsigned_long)> *fn)

{
  pointer paVar1;
  ulong uVar2;
  long lVar3;
  sub_form tmp;
  ulong local_48;
  sub_form local_40;
  
  paVar1 = (this->value_->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->value_->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
      super__Vector_impl_data._M_finish != paVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      local_40.variant_ = (any *)((long)&paVar1->_M_manager + lVar3);
      local_40.error_ = this->error_;
      local_48 = uVar2;
      if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*fn->_M_invoker)((_Any_data *)fn,&local_40,&local_48);
      uVar2 = uVar2 + 1;
      paVar1 = (this->value_->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)(this->value_->
                                   super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)paVar1 >> 4));
  }
  return;
}

Assistant:

void array_validator::for_each(const std::function<void(sub_form& element, size_t index)>& fn)
  {
    for (size_t i = 0; i < this->value_.size(); ++i)
    {
      sub_form tmp(this->value_[i], this->error_);
      fn(tmp, i);
    }
  }